

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

ArrowTypeExtension * __thiscall
duckdb::DBConfig::GetArrowExtension
          (ArrowTypeExtension *__return_storage_ptr__,DBConfig *this,ArrowExtensionMetadata *info)

{
  pthread_mutex_t *__mutex;
  pointer pAVar1;
  ArrowExtensionMetadata AStack_a8;
  
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(&this->arrow_extensions);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  pAVar1 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
           ::operator->(&this->arrow_extensions);
  ArrowExtensionMetadata::ArrowExtensionMetadata(&AStack_a8,info);
  GetArrowExtensionInternal(__return_storage_ptr__,&pAVar1->type_extensions,&AStack_a8);
  ArrowExtensionMetadata::~ArrowExtensionMetadata(&AStack_a8);
  pthread_mutex_unlock(__mutex);
  return __return_storage_ptr__;
}

Assistant:

ArrowTypeExtension DBConfig::GetArrowExtension(ArrowExtensionMetadata info) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	return GetArrowExtensionInternal(arrow_extensions->type_extensions, std::move(info));
}